

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp.cpp
# Opt level: O3

TRIPLERGB **
decimationEjection(BITMAPFILEHEADER bmFile,BITMAPINFOHEADER bmInfo,TRIPLERGB **mrx,int k,
                  char *filepath)

{
  TRIPLERGB *pTVar1;
  ulong uVar2;
  BITMAPINFOHEADER bmInfo_00;
  int iVar3;
  int iVar4;
  TRIPLERGB **matrix;
  TRIPLERGB *pTVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  
  uVar10 = (ulong)bmInfo.biHeight;
  iVar6 = 0;
  uVar2 = (ulong)bmInfo.biWidth / (ulong)(uint)k;
  iVar3 = (int)uVar2;
  iVar4 = (int)(uVar10 / (uint)k);
  matrix = (TRIPLERGB **)operator_new__((uVar10 / (uint)k) * 8);
  if (uVar10 != 0) {
    uVar11 = 0;
    do {
      if (uVar11 % (ulong)(long)k == (long)(k + -1)) {
        pTVar5 = (TRIPLERGB *)operator_new__(uVar2 * 3);
        matrix[iVar6] = pTVar5;
        if (bmInfo.biWidth != 0) {
          uVar7 = 0;
          lVar8 = 2;
          iVar9 = 0;
          do {
            if (uVar7 % (ulong)(long)k == (long)(k + -1)) {
              pTVar1 = mrx[uVar11];
              pTVar5[iVar9].red = (&pTVar1->blue)[lVar8];
              pTVar5[iVar9].green = *(uchar *)((long)pTVar1 + lVar8 + -1);
              pTVar5[iVar9].blue = *(uchar *)((long)pTVar1 + lVar8 + -2);
              iVar9 = iVar9 + 1;
            }
            uVar7 = uVar7 + 1;
            lVar8 = lVar8 + 3;
          } while (bmInfo.biWidth != uVar7);
        }
        iVar6 = iVar6 + 1;
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != uVar10);
  }
  bmInfo_00.biWidth = iVar3;
  bmInfo_00.biSize = bmInfo.biSize;
  bmInfo_00.biPlanes = bmInfo.biPlanes;
  bmInfo_00.biBitCount = bmInfo.biBitCount;
  bmInfo_00.biHeight = iVar4;
  bmInfo_00.biSizeImage = iVar3 * iVar4 * 3;
  bmInfo_00.biCompression = bmInfo.biCompression;
  bmInfo_00.biXPelsPerMeter = bmInfo.biXPelsPerMeter;
  bmInfo_00.biYPelsPerMeter = bmInfo.biYPelsPerMeter;
  bmInfo_00.biClrUsed = bmInfo.biClrUsed;
  bmInfo_00.biClrImportant = bmInfo.biClrImportant;
  saveBMPFile(bmFile,bmInfo_00,matrix,filepath);
  return matrix;
}

Assistant:

TRIPLERGB **decimationEjection(BITMAPFILEHEADER bmFile,
                               BITMAPINFOHEADER bmInfo,
                               TRIPLERGB **mrx, int k, const char *filepath) {
    unsigned int originH = bmInfo.biHeight;
    unsigned int originW = bmInfo.biWidth;
    bmInfo.biWidth = originW / k;
    bmInfo.biHeight = originH / k;
    bmInfo.biSizeImage = bmInfo.biWidth * bmInfo.biHeight * 3;
    //cout << "Decimation... New size = " << m_bmInfo.biSizeImage << "\n";
    TRIPLERGB **decMrx = new TRIPLERGB *[bmInfo.biHeight];
    int idH = 0;
    for (size_t i = 0; i < originH; i++) {
        if ((i % k) == (k - 1)) {
            decMrx[idH] = new TRIPLERGB[bmInfo.biWidth];
            int idW = 0;
            for (size_t j = 0; j < originW; j++) {
                if ((j % k) == (k - 1)) {
                    decMrx[idH][idW].red = mrx[i][j].red;
                    decMrx[idH][idW].green = mrx[i][j].green;
                    decMrx[idH][idW].blue = mrx[i][j].blue;
                    idW++;
                }
            }
            idH++;
        }
    }
    saveBMPFile(bmFile, bmInfo, decMrx, filepath);
    return decMrx;
}